

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O1

void __thiscall QGraphicsOpacityEffect::draw(QGraphicsOpacityEffect *this,QPainter *painter)

{
  long *plVar1;
  byte bVar2;
  char cVar3;
  undefined4 uVar4;
  qreal *pqVar5;
  long lVar6;
  QTransform *pQVar7;
  QGraphicsEffectPrivate *d;
  long in_FS_OFFSET;
  byte bVar8;
  QPainter pixmapPainter;
  QPoint offset;
  QTransform worldTransform;
  undefined1 local_100 [8];
  undefined1 *local_f8;
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  QTransform local_d8;
  QTransform local_88;
  long local_38;
  
  bVar8 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  if ((*(byte *)(lVar6 + 0xb8) & 1) == 0) {
    if ((*(byte *)(lVar6 + 0xb8) & 6) == 2) {
      if (*(QGraphicsEffectSource **)(lVar6 + 0x78) != (QGraphicsEffectSource *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QGraphicsEffectSource::draw(*(QGraphicsEffectSource **)(lVar6 + 0x78),painter);
          return;
        }
        goto LAB_00399f8e;
      }
    }
    else {
      local_e0 = 0.0;
      if (*(long *)(lVar6 + 0x78) == 0) {
        bVar2 = 0;
      }
      else {
        bVar2 = (**(code **)(**(long **)(*(long *)(lVar6 + 0x78) + 8) + 0x60))();
      }
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      local_f8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsEffect::sourcePixmap
                ((QGraphicsEffect *)&local_f8,(CoordinateSystem)this,(QPoint *)(ulong)bVar2,
                 (PixmapPadMode)&local_e0);
      cVar3 = QPixmap::isNull();
      if (cVar3 == '\0') {
        QPainter::save();
        QPainter::setOpacity(*(double *)(lVar6 + 0xa8));
        if ((*(byte *)(lVar6 + 0xb8) & 4) != 0) {
          local_100 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          QPainter::QPainter((QPainter *)local_100,(QPaintDevice *)&local_f8);
          uVar4 = QPainter::renderHints();
          QPainter::setRenderHints((QPainter *)local_100,uVar4,1);
          QPainter::setCompositionMode((CompositionMode)(QPainter *)local_100);
          if (bVar2 == 0) {
            pqVar5 = (qreal *)&DAT_006dc5a0;
            pQVar7 = &local_88;
            for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
              pQVar7->m_matrix[0][0] = *pqVar5;
              pqVar5 = pqVar5 + (ulong)bVar8 * -2 + 1;
              pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar8 * -2 + 1) * 8);
            }
            pqVar5 = (qreal *)QPainter::worldTransform();
            pQVar7 = &local_88;
            for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
              pQVar7->m_matrix[0][0] = *pqVar5;
              pqVar5 = pqVar5 + (ulong)bVar8 * -2 + 1;
              pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar8 * -2 + 1) * 8);
            }
            QTransform::fromTranslate((double)-(int)local_e0,(double)-local_e0._4_4_);
            QTransform::operator*=(&local_88,&local_d8);
            QPainter::setWorldTransform((QTransform *)local_100,SUB81(&local_88,0));
            lVar6 = *(long *)(*(long *)&(this->super_QGraphicsEffect).field_0x8 + 0x78);
            if (lVar6 == 0) {
              local_d8.m_matrix[0][2] = 0.0;
              local_d8.m_matrix[1][0] = 0.0;
              local_d8.m_matrix[0][0] = 0.0;
              local_d8.m_matrix[0][1] = 0.0;
            }
            else {
              plVar1 = *(long **)(lVar6 + 8);
              (**(code **)(*plVar1 + 0x28))(&local_d8,plVar1,1);
            }
            QPainter::fillRect((QRectF *)local_100,(QBrush *)&local_d8);
          }
          else {
            local_88.m_matrix[0][0] = (qreal)-SUB84(local_e0,0);
            local_88.m_matrix[0][1] = (qreal)-(int)((ulong)local_e0 >> 0x20);
            QPainter::translate((QPointF *)local_100);
            local_88.m_matrix[0]._0_16_ = QPixmap::rect();
            QPainter::fillRect((QRect *)local_100,(QBrush *)&local_88);
          }
          QPainter::~QPainter((QPainter *)local_100);
        }
        if (bVar2 == 0) {
          pqVar5 = (qreal *)&DAT_006dd1b8;
          pQVar7 = &local_88;
          for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
            pQVar7->m_matrix[0][0] = *pqVar5;
            pqVar5 = pqVar5 + (ulong)bVar8 * -2 + 1;
            pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar8 * -2 + 1) * 8);
          }
          local_88._72_2_ = local_88._72_2_ & 0xfc00;
          QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_88,0));
        }
        local_88.m_matrix[0][0] = (qreal)SUB84(local_e0,0);
        local_88.m_matrix[0][1] = (qreal)(int)((ulong)local_e0 >> 0x20);
        QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_88);
        QPainter::restore();
      }
      QPixmap::~QPixmap((QPixmap *)&local_f8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00399f8e:
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsOpacityEffect);

    // Transparent; nothing to draw.
    if (d->isFullyTransparent)
        return;

    // Opaque; draw directly without going through a pixmap.
    if (d->isFullyOpaque && !d->hasOpacityMask) {
        drawSource(painter);
        return;
    }

    QPoint offset;
    Qt::CoordinateSystem system = sourceIsPixmap() ? Qt::LogicalCoordinates : Qt::DeviceCoordinates;
    QPixmap pixmap = sourcePixmap(system, &offset, QGraphicsEffect::NoPad);
    if (pixmap.isNull())
        return;

    painter->save();
    painter->setOpacity(d->opacity);

    if (d->hasOpacityMask) {
        QPainter pixmapPainter(&pixmap);
        pixmapPainter.setRenderHints(painter->renderHints());
        pixmapPainter.setCompositionMode(QPainter::CompositionMode_DestinationIn);
        if (system == Qt::DeviceCoordinates) {
            QTransform worldTransform = painter->worldTransform();
            worldTransform *= QTransform::fromTranslate(-offset.x(), -offset.y());
            pixmapPainter.setWorldTransform(worldTransform);
            pixmapPainter.fillRect(sourceBoundingRect(), d->opacityMask);
        } else {
            pixmapPainter.translate(-offset);
            pixmapPainter.fillRect(pixmap.rect(), d->opacityMask);
        }
    }

    if (system == Qt::DeviceCoordinates)
        painter->setWorldTransform(QTransform());

    painter->drawPixmap(offset, pixmap);
    painter->restore();
}